

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<double>::data(QList<double> *this)

{
  QArrayDataPointer<double> *this_00;
  double *pdVar1;
  QArrayDataPointer<double> *in_RDI;
  
  detach((QList<double> *)0x5cc94c);
  this_00 = (QArrayDataPointer<double> *)QArrayDataPointer<double>::operator->(in_RDI);
  pdVar1 = QArrayDataPointer<double>::data(this_00);
  return pdVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }